

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramid.cc
# Opt level: O2

void __thiscall
ParamMeasure::walkforward(ParamMeasure *this,WalkState *state,PcodeOp *ignoreop,Varnode *vn)

{
  OpCode OVar1;
  PcodeOp *this_00;
  BlockBasic *pBVar2;
  ParamRank PVar3;
  int4 iVar4;
  ParamRank PVar5;
  int iVar6;
  _List_node_base *p_Var7;
  bool bVar8;
  
  iVar6 = state->depth;
  state->depth = iVar6 + 1;
  if (iVar6 < 9) {
    p_Var7 = (_List_node_base *)&vn->descend;
LAB_003311d2:
    do {
      PVar5 = this->rank;
      if ((PVar5 == state->terminalrank) ||
         (p_Var7 = (((_List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_> *)&p_Var7->_M_next)->_M_impl
                   )._M_node.super__List_node_base._M_next,
         p_Var7 == (_List_node_base *)&vn->descend)) goto LAB_0033131f;
      this_00 = (PcodeOp *)p_Var7[1]._M_next;
    } while (this_00 == ignoreop);
    OVar1 = this_00->opcode->opcode;
    switch(OVar1) {
    case CPUI_BRANCH:
    case CPUI_BRANCHIND:
      iVar4 = PcodeOp::getSlot(this_00,vn);
      if (iVar4 == 0) goto LAB_003312dc;
      goto LAB_003311d2;
    case CPUI_CBRANCH:
      iVar4 = PcodeOp::getSlot(this_00,vn);
      if (1 < iVar4) goto LAB_003311d2;
LAB_003312dc:
      PVar5 = this->rank;
switchD_00331215_caseD_9:
      bVar8 = (int)PVar5 < 2;
      if (state->best != false) {
        bVar8 = 2 < (int)PVar5;
      }
      bVar8 = !bVar8;
      PVar3 = DIRECTREAD;
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
      iVar4 = PcodeOp::getSlot(this_00,vn);
      if (iVar4 == 0) goto LAB_003312dc;
      this->numcalls = this->numcalls + 1;
      PVar5 = this->rank;
      bVar8 = (int)PVar5 < 4;
      if (state->best != false) {
        bVar8 = 4 < (int)PVar5;
      }
      bVar8 = !bVar8;
      PVar3 = SUBFNPARAM;
      break;
    case CPUI_CALLOTHER:
      goto switchD_00331215_caseD_9;
    case CPUI_RETURN:
      bVar8 = (int)PVar5 < 5;
      if (state->best != false) {
        bVar8 = 5 < (int)PVar5;
      }
      bVar8 = !bVar8;
      PVar3 = SUBFNRETURN;
      break;
    default:
      if (OVar1 == CPUI_MULTIEQUAL) {
        pBVar2 = this_00->parent;
        iVar4 = PcodeOp::getSlot(this_00,vn);
        if (((pBVar2->super_FlowBlock).intothis.
             super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
             super__Vector_impl_data._M_start[iVar4].label & 2) == 0) {
          walkforward(this,state,(PcodeOp *)0x0,this_00->output);
        }
        goto LAB_003311d2;
      }
      if (OVar1 != CPUI_INDIRECT) goto switchD_00331215_caseD_9;
      bVar8 = (int)PVar5 < 6;
      if (state->best != false) {
        bVar8 = 6 < (int)PVar5;
      }
      bVar8 = !bVar8;
      PVar3 = INDIRECT;
    }
    if (!bVar8) {
      PVar5 = PVar3;
    }
    this->rank = PVar5;
    goto LAB_003311d2;
  }
LAB_00331324:
  state->depth = iVar6;
  return;
LAB_0033131f:
  iVar6 = state->depth + -1;
  goto LAB_00331324;
}

Assistant:

void ParamMeasure::walkforward( WalkState &state, PcodeOp *ignoreop, Varnode *vn )

{
  state.depth += 1;
  if (state.depth >= MAXDEPTH) {
    state.depth -= 1;
    return;
  }
  list<PcodeOp *>::const_iterator iter = vn->beginDescend();
  while( rank != state.terminalrank && iter != vn->endDescend() ) {
    PcodeOp *op = *iter;
    if( op != ignoreop ) {
      OpCode oc = op->getOpcode()->getOpcode();
      switch( oc ) {
      case CPUI_BRANCH:
      case CPUI_BRANCHIND:
	if( op->getSlot(vn) == 0 ) updaterank( DIRECTREAD, state.best );
	break;
      case CPUI_CBRANCH:
        if( op->getSlot(vn) < 2 ) updaterank( DIRECTREAD, state.best );
        break;
      case CPUI_CALL:
      case CPUI_CALLIND:
        if( op->getSlot(vn) == 0 ) updaterank( DIRECTREAD, state.best );
        else {
          numcalls++;
          updaterank( SUBFNPARAM, state.best );
        }
        break;
      case CPUI_CALLOTHER:
        updaterank( DIRECTREAD, state.best );
        break;
      case CPUI_RETURN:
        updaterank( THISFNRETURN, state.best );
        break;
      case CPUI_INDIRECT:
        updaterank( INDIRECT, state.best );
        break;
      case CPUI_MULTIEQUAL:
        // The only op for which there can be a loop in the graph is with the MULTIEQUAL (not for CALL, etc.).
        // Walk forward only if the path is not part of a loop.
        if( !op->getParent()->isLoopIn(op->getSlot(vn)) ) walkforward( state, (PcodeOp *)0, op->getOut() );
        break;
      default:
        updaterank( DIRECTREAD, state.best );
        break;
      }
    }
    iter++;
  }
  state.depth -= 1;
}